

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::CalculateCandidateOffsets
          (BamStandardIndex *this,BaiReferenceSummary *refSummary,uint64_t *minOffset,
          set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
          *candidateBins,vector<long,_std::allocator<long>_> *offsets)

{
  bool bVar1;
  BamStandardIndex *in_RCX;
  ulong *in_RDX;
  int *in_RSI;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *in_RDI;
  int64_t *in_R8;
  int j;
  uint64_t chunkStop;
  uint64_t chunkStart;
  size_t offset;
  int i;
  iterator candidateBinIter;
  int32_t numAlignmentChunks;
  uint32_t binId;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  *in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff68;
  _Rb_tree_const_iterator<unsigned_short> in_stack_ffffffffffffff70;
  int local_7c;
  ulong local_78;
  uint64_t local_70;
  long local_68;
  _Self local_60;
  undefined2 local_52;
  _Base_ptr local_50;
  int local_44;
  _Rb_tree_const_iterator<unsigned_short> local_40;
  int local_38;
  undefined4 local_34;
  
  Seek(in_RCX,in_R8,(int)((ulong)*(undefined8 *)(in_RSI + 2) >> 0x20));
  std::_Rb_tree_const_iterator<unsigned_short>::_Rb_tree_const_iterator(&local_40);
  local_44 = 0;
  do {
    if (*in_RSI <= local_44) {
      return;
    }
    ReadBinIntoBuffer((BamStandardIndex *)in_stack_ffffffffffffff70._M_node,
                      &(in_stack_ffffffffffffff68._M_node)->_M_color,(int32_t *)in_RDI);
    local_52 = (undefined2)local_34;
    local_50 = (_Base_ptr)
               std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               ::find(in_stack_ffffffffffffff68._M_node,(key_type_conflict4 *)in_RDI);
    local_40._M_node = local_50;
    local_60._M_node =
         (_Base_ptr)
         std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::end
                   (in_stack_ffffffffffffff58);
    bVar1 = std::operator==(&local_40,&local_60);
    if (!bVar1) {
      local_68 = 0;
      for (local_7c = 0; local_7c < local_38; local_7c = local_7c + 1) {
        local_70 = *(uint64_t *)(*(long *)&in_RDI[2]._M_t._M_impl + local_68);
        local_78 = *(ulong *)(*(long *)&in_RDI[2]._M_t._M_impl + local_68 + 8);
        local_68 = local_68 + 0x10;
        if ((undefined1  [48])((undefined1  [48])in_RDI[1]._M_t._M_impl & (undefined1  [48])0x1) !=
            (undefined1  [48])0x0) {
          SwapEndian_64(&local_70);
          SwapEndian_64(&local_78);
        }
        if (*in_RDX <= local_78) {
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)in_RDI,
                     (value_type_conflict8 *)in_stack_ffffffffffffff58);
        }
      }
      in_stack_ffffffffffffff70._M_node = local_40._M_node;
      in_stack_ffffffffffffff68 =
           std::set<unsigned_short,std::less<unsigned_short>,std::allocator<unsigned_short>>::
           erase_abi_cxx11_(in_RDI,in_stack_ffffffffffffff68._M_node);
      bVar1 = std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::
              empty((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)0x28b845);
      if (bVar1) {
        return;
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void BamStandardIndex::CalculateCandidateOffsets(const BaiReferenceSummary& refSummary,
                                                 const uint64_t& minOffset,
                                                 std::set<uint16_t>& candidateBins,
                                                 std::vector<int64_t>& offsets)
{
    // seek to first bin
    Seek(refSummary.FirstBinFilePosition, SEEK_SET);

    // iterate over reference bins
    uint32_t binId;
    int32_t numAlignmentChunks;
    std::set<uint16_t>::iterator candidateBinIter;
    for (int i = 0; i < refSummary.NumBins; ++i) {

        // read bin contents (if successful, alignment chunks are now in m_buffer)
        ReadBinIntoBuffer(binId, numAlignmentChunks);

        // see if bin is a 'candidate bin'
        candidateBinIter = candidateBins.find(binId);

        // if not, move on to next bin
        if (candidateBinIter == candidateBins.end()) continue;

        // otherwise, check bin's contents against for overlap
        else {

            std::size_t offset = 0;
            uint64_t chunkStart;
            uint64_t chunkStop;

            // iterate over alignment chunks
            for (int j = 0; j < numAlignmentChunks; ++j) {

                // read chunk start & stop from buffer
                memcpy((char*)&chunkStart, m_resources.Buffer + offset, sizeof(uint64_t));
                offset += sizeof(uint64_t);
                memcpy((char*)&chunkStop, m_resources.Buffer + offset, sizeof(uint64_t));
                offset += sizeof(uint64_t);

                // swap endian-ness if necessary
                if (m_isBigEndian) {
                    SwapEndian_64(chunkStart);
                    SwapEndian_64(chunkStop);
                }

                // store alignment chunk's start offset
                // if its stop offset is larger than our 'minOffset'
                if (chunkStop >= minOffset) offsets.push_back(chunkStart);
            }

            // 'pop' bin ID from candidate bins set
            candidateBins.erase(candidateBinIter);

            // quit if no more candidates
            if (candidateBins.empty()) break;
        }
    }
}